

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O2

void __thiscall QHttpSocketEngine::slotSocketConnected(QHttpSocketEngine *this)

{
  long lVar1;
  QAuthenticatorPrivate *this_00;
  QStringView host;
  char *pcVar2;
  bool bVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  qsizetype i;
  long i_00;
  long in_FS_OFFSET;
  QLatin1StringView QVar6;
  QByteArrayView requestMethod;
  QByteArrayView path;
  QArrayDataPointer<char16_t> local_110;
  qsizetype local_f8;
  storage_type_conflict *psStack_f0;
  QArrayDataPointer<char> local_e8;
  QHttpHeaders headers;
  QArrayDataPointer<char> local_c8;
  QArrayDataPointer<char> local_a8;
  QArrayDataPointer<char> local_88;
  QStringBuilder<QStringBuilder<QStringBuilder<QByteArrayView,_const_char_(&)[3]>,_QByteArrayView>,_const_char_(&)[3]>
  local_70;
  char local_40 [8];
  long local_38;
  
  local_70.a.a.a.m_data = (storage_type *)local_70.a.a.a.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  builtin_strncpy(local_40,"CONNECT",8);
  local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d._0_4_ = 0xaaaaaaaa;
  local_88.d._4_4_ = 0xaaaaaaaa;
  local_88.ptr._0_4_ = 0xaaaaaaaa;
  local_88.ptr._4_4_ = 0xaaaaaaaa;
  if (*(long *)(lVar1 + 0xf0) == 0) {
    QHostAddress::toString((QString *)&local_70,(QHostAddress *)(lVar1 + 0xb8));
    QString::toLatin1_helper_inplace((QString *)&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_70);
  }
  else {
    QUrl::toAce(&local_88,lVar1 + 0xe0,0);
  }
  local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::number((int)&local_c8,(uint)*(ushort *)(lVar1 + 0xc0));
  local_70.a.b.m_data = (storage_type *)local_c8.size;
  local_70.a.b.m_size = (qsizetype)local_c8.ptr;
  local_70.a.a.b = (char (*) [3])local_c8.d;
  local_70.a.a.a.m_data._0_1_ = 0x3a;
  local_70.a.a.a.m_size = (qsizetype)&local_88;
  local_c8.d = (Data *)0x0;
  local_c8.ptr = (char *)0x0;
  local_c8.size = 0;
  QStringBuilder<QStringBuilder<QByteArray_&,_char>,_QByteArray>::convertTo<QByteArray>
            ((QByteArray *)&local_a8,
             (QStringBuilder<QStringBuilder<QByteArray_&,_char>,_QByteArray> *)&local_70);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_70.a.a.b);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_c8);
  local_c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)&local_c8,local_40,-1);
  QByteArray::append((char)&local_c8);
  QByteArray::append((QByteArray *)&local_c8);
  QByteArray::append((QByteArray *)&local_c8," HTTP/1.1\r\n");
  QByteArray::append((QByteArray *)&local_c8,"Proxy-Connection: keep-alive\r\n");
  local_70.a.a.a.m_data = (storage_type *)&local_88;
  local_70.a.a.a.m_size = (qsizetype)"Host: ";
  local_70.a.a.b = (char (*) [3])0x24e55a;
  ::operator+=((QByteArray *)&local_c8,
               (QStringBuilder<QStringBuilder<const_char_(&)[7],_QByteArray_&>,_const_char_(&)[3]> *
               )&local_70);
  headers.d.d.ptr = (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkProxy::headers((QNetworkProxy *)&headers);
  bVar3 = QHttpHeaders::contains(&headers,UserAgent);
  if (!bVar3) {
    QByteArray::append((QByteArray *)&local_c8,"User-Agent: Mozilla/5.0\r\n");
  }
  i_00 = 0;
  while( true ) {
    qVar4 = QHttpHeaders::size(&headers);
    if (qVar4 <= i_00) break;
    QVar6 = QHttpHeaders::nameAt(&headers,i_00);
    local_70.a.b = QHttpHeaders::valueAt(&headers,i_00);
    local_70.a.a.b = (char (*) [3])0x25f9e5;
    local_70.b = (char (*) [3])0x24e55a;
    local_70.a.a.a = (QByteArrayView)QVar6;
    ::operator+=((QByteArray *)&local_c8,&local_70);
    i_00 = i_00 + 1;
  }
  this_00 = *(QAuthenticatorPrivate **)(lVar1 + 0x110);
  if ((this_00 != (QAuthenticatorPrivate *)0x0) && (this_00->method != None)) {
    *(undefined1 *)(lVar1 + 0x11e) = 1;
    qVar5 = QByteArrayView::lengthHelperCharArray(local_40,8);
    qVar4 = local_a8.size;
    pcVar2 = local_a8.ptr;
    QNetworkProxy::hostName((QString *)&local_110,(QNetworkProxy *)(lVar1 + 0xd8));
    local_f8 = local_110.size;
    psStack_f0 = local_110.ptr;
    host.m_data = local_110.ptr;
    host.m_size = local_110.size;
    requestMethod.m_data = local_40;
    requestMethod.m_size = qVar5;
    path.m_data = pcVar2;
    path.m_size = qVar4;
    QAuthenticatorPrivate::calculateResponse
              ((QByteArray *)&local_e8,this_00,requestMethod,path,host);
    qVar4 = local_e8.size;
    local_70.a.a.b = (char (*) [3])local_e8.ptr;
    local_70.a.a.a.m_data = (storage_type *)local_e8.d;
    local_e8.d = (Data *)0x0;
    local_e8.ptr = (char *)0x0;
    local_70.a.a.a.m_size = (qsizetype)"Proxy-Authorization: ";
    local_e8.size = 0;
    local_70.a.b.m_size = qVar4;
    ::operator+=((QByteArray *)&local_c8,(QStringBuilder<const_char_(&)[22],_QByteArray> *)&local_70
                );
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_70.a.a.a.m_data);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_e8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_110);
    QByteArray::append((QByteArray *)&local_c8,"\r\n");
  }
  QByteArray::append((QByteArray *)&local_c8,"\r\n");
  QIODevice::write(*(QByteArray **)(lVar1 + 0xf8));
  *(undefined4 *)(lVar1 + 0x108) = 1;
  QHttpHeaders::~QHttpHeaders(&headers);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_c8);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_a8);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpSocketEngine::slotSocketConnected()
{
    Q_D(QHttpSocketEngine);

    // Send the greeting.
    const char method[] = "CONNECT";
    QByteArray peerAddress = d->peerName.isEmpty() ?
                             d->peerAddress.toString().toLatin1() :
                             QUrl::toAce(d->peerName);
    QByteArray path = peerAddress + ':' + QByteArray::number(d->peerPort);
    QByteArray data = method;
    data += ' ';
    data += path;
    data += " HTTP/1.1\r\n";
    data += "Proxy-Connection: keep-alive\r\n";
    data += "Host: " + peerAddress + "\r\n";
    const auto headers = d->proxy.headers();
    if (!headers.contains(QHttpHeaders::WellKnownHeader::UserAgent))
        data += "User-Agent: Mozilla/5.0\r\n";
    for (qsizetype i = 0; i < headers.size(); ++i) {
        const auto name = headers.nameAt(i);
        data += QByteArrayView(name.data(), name.size()) + ": "
                + headers.valueAt(i) + "\r\n";
    }
    QAuthenticatorPrivate *priv = QAuthenticatorPrivate::getPrivate(d->authenticator);
    //qDebug() << "slotSocketConnected: priv=" << priv << (priv ? (int)priv->method : -1);
    if (priv && priv->method != QAuthenticatorPrivate::None) {
        d->credentialsSent = true;
        data += "Proxy-Authorization: " + priv->calculateResponse(method, path, d->proxy.hostName());
        data += "\r\n";
    }
    data += "\r\n";
//     qDebug() << ">>>>>>>> sending request" << this;
//     qDebug() << data;
//     qDebug(">>>>>>>");
    d->socket->write(data);
    d->state = ConnectSent;
}